

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O1

RK_S32 mpi_dec_opt_slt(void *ctx,char *next)

{
  size_t __n;
  char *__dest;
  
  if ((next != (char *)0x0) && (__n = strnlen(next,0x100), __n != 0)) {
    __dest = (char *)mpp_osal_calloc("mpi_dec_opt_slt",__n + 1);
    *(char **)((long)ctx + 600) = __dest;
    strncpy(__dest,next,__n);
    return 1;
  }
  _mpp_log_l(2,"mpi_dec_utils","input slt verify file is invalid\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_dec_opt_slt(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        size_t len = strnlen(next, MAX_FILE_NAME_LENGTH);
        if (len) {
            cmd->file_slt = mpp_calloc(char, len + 1);
            strncpy(cmd->file_slt, next, len);

            return 1;
        }
    }

    mpp_err("input slt verify file is invalid\n");
    return 0;
}